

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTailcalleeParamTypes(CWriter *this)

{
  Func *name;
  bool bVar1;
  Index IVar2;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *this_00;
  reference ppFVar3;
  vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_> *this_01;
  reference ppTVar4;
  FuncType *this_02;
  FuncType *func_type;
  TypeEntry *type;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_> *__range2_1;
  Func *func;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *__range2;
  CWriter *this_local;
  
  this_00 = &this->module_->funcs;
  __end2 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::begin(this_00);
  func = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
                                     *)&func), bVar1) {
    ppFVar3 = __gnu_cxx::
              __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
              ::operator*(&__end2);
    name = *ppFVar3;
    bVar1 = IsImport(this,&name->name);
    if (((bVar1) || (((name->features_used).tailcall & 1U) != 0)) &&
       (IVar2 = FuncSignature::GetNumParams(&(name->decl).sig), 1 < IVar2)) {
      DeclareStruct(this,&(name->decl).sig.param_types);
    }
    __gnu_cxx::
    __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
    ::operator++(&__end2);
  }
  this_01 = &this->module_->types;
  __end2_1 = std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::begin(this_01);
  type = (TypeEntry *)
         std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<wabt::TypeEntry_*const_*,_std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>_>
                             *)&type), bVar1) {
    ppTVar4 = __gnu_cxx::
              __normal_iterator<wabt::TypeEntry_*const_*,_std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>_>
              ::operator*(&__end2_1);
    this_02 = cast<wabt::FuncType,wabt::TypeEntry>(*ppTVar4);
    IVar2 = FuncType::GetNumParams(this_02);
    if ((1 < IVar2) && (((this_02->features_used).tailcall & 1U) != 0)) {
      DeclareStruct(this,&(this_02->sig).param_types);
    }
    __gnu_cxx::
    __normal_iterator<wabt::TypeEntry_*const_*,_std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>_>
    ::operator++(&__end2_1);
  }
  return;
}

Assistant:

void CWriter::WriteTailcalleeParamTypes() {
  // A structure for the spilled parameters of a tail-callee is needed in
  // three cases: for a function that makes a tail-call (and therefore
  // will have a tail-callee version generated), for any imported function
  // (for which wasm2c generates a weak import that presents the tail-callee
  // interface, in case the exporting module doesn't generate one itself), and
  // for any type entry referenced in a return_call_indirect instruction.

  for (const Func* func : module_->funcs) {
    if (IsImport(func->name) || func->features_used.tailcall) {
      if (func->decl.sig.GetNumParams() > 1) {
        DeclareStruct(func->decl.sig.param_types);
      }
    }
  }

  for (TypeEntry* type : module_->types) {
    FuncType* func_type = cast<FuncType>(type);
    if (func_type->GetNumParams() > 1 && func_type->features_used.tailcall) {
      DeclareStruct(func_type->sig.param_types);
    }
  }
}